

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O2

bool __thiscall
dlib::mfp_kernel_1_base_class<0UL>::
mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::menu_bar>_>::is_same
          (mp_impl_T<dlib::member_function_pointer<void,_void,_void,_void>::mp_impl<dlib::menu_bar>_>
           *this,mp_base_base *item)

{
  void *pvVar1;
  bool bVar2;
  
  pvVar1 = (this->super_mp_impl<dlib::menu_bar>).super_mp_base.super_mp_base_base.o;
  bVar2 = true;
  if (item->o != (void *)0x0 || pvVar1 != (void *)0x0) {
    if ((item->o != pvVar1) ||
       ((this->super_mp_impl<dlib::menu_bar>).super_mp_base.super_mp_base_base.type != item->type))
    {
      return false;
    }
    bVar2 = (item[1].o == *(void **)&(this->super_mp_impl<dlib::menu_bar>).field_0x20 ||
            item[1]._vptr_mp_base_base == (_func_int **)0x0) &&
            item[1]._vptr_mp_base_base ==
            (_func_int **)(this->super_mp_impl<dlib::menu_bar>).callback;
  }
  return bVar2;
}

Assistant:

bool is_same (const mp_base_base* item) const 
            {
                if (item->o == 0 && this->o == 0)
                {
                    return true;
                }
                else if (item->o == this->o && this->type == item->type)
                {
                    const mp_impl* i = reinterpret_cast<const mp_impl*>(item);
                    return (i->callback == this->callback);
                }
                return false;
            }